

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void stranspose(double *sig,int rows,int cols,double *col)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  ulong uVar5;
  
  uVar1 = 0;
  uVar2 = 0;
  if (0 < cols) {
    uVar2 = (ulong)(uint)cols;
  }
  uVar3 = 0;
  if (0 < rows) {
    uVar3 = (ulong)(uint)rows;
  }
  for (; uVar1 != uVar3; uVar1 = uVar1 + 1) {
    pdVar4 = col;
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      *pdVar4 = sig[uVar5];
      pdVar4 = pdVar4 + rows;
    }
    sig = sig + cols;
    col = col + 1;
  }
  return;
}

Assistant:

void stranspose(double *sig, int rows, int cols,double *col) {
	int t,u;
	register int i,j;
	#pragma omp parallel for private(i,j,t,u)
	for (i=0; i < rows; i++) {
		t = i * cols;
		u = 0;
		for (j=0; j < cols; j++) {
			col[u+i] = sig[j+t];
			u+=rows;
		}
	}
	
}